

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O0

void rsg::anon_unknown_0::setInfiniteRange(ValueRangeAccess valueRange)

{
  int iVar1;
  Type TVar2;
  int iVar3;
  Exception *this;
  allocator<char> local_121;
  string local_120;
  ConstStridedValueAccess<1> local_100;
  ConstStridedValueAccess<1> local_f0;
  Scalar local_dc;
  ConstStridedValueAccess<1> local_d8;
  ConstStridedValueAccess<1> local_c8;
  Scalar local_b8;
  int local_b4;
  undefined1 auStack_b0 [4];
  int ndx_2;
  ConstStridedValueAccess<1> local_a0;
  Scalar local_8c;
  ConstStridedValueAccess<1> local_88;
  ConstStridedValueAccess<1> local_78;
  Scalar local_68;
  int local_64;
  undefined1 auStack_60 [4];
  int ndx_1;
  ConstStridedValueAccess<1> local_50;
  Scalar local_3c;
  ConstStridedValueAccess<1> local_38;
  ConstStridedValueAccess<1> local_28;
  Scalar local_18;
  int local_14;
  VariableType *pVStack_10;
  int ndx;
  VariableType *type;
  
  pVStack_10 = ConstValueRangeAccess::getType((ConstValueRangeAccess *)&stack0x00000008);
  TVar2 = VariableType::getBaseType(pVStack_10);
  if (TVar2 == TYPE_FLOAT) {
    for (local_b4 = 0; iVar1 = local_b4, iVar3 = VariableType::getNumElements(pVStack_10),
        iVar1 < iVar3; local_b4 = local_b4 + 1) {
      local_b8 = Scalar::min<float>();
      local_d8 = (ConstStridedValueAccess<1>)
                 ValueRangeAccess::getMin((ValueRangeAccess *)&stack0x00000008);
      local_c8 = (ConstStridedValueAccess<1>)
                 StridedValueAccess<1>::component((StridedValueAccess<1> *)&local_d8,local_b4);
      StridedValueAccess<1>::operator=((StridedValueAccess<1> *)&local_c8,local_b8);
      local_dc = Scalar::max<float>();
      local_100 = (ConstStridedValueAccess<1>)
                  ValueRangeAccess::getMax((ValueRangeAccess *)&stack0x00000008);
      local_f0 = (ConstStridedValueAccess<1>)
                 StridedValueAccess<1>::component((StridedValueAccess<1> *)&local_100,local_b4);
      StridedValueAccess<1>::operator=((StridedValueAccess<1> *)&local_f0,local_dc);
    }
  }
  else if (TVar2 == TYPE_INT) {
    for (local_64 = 0; iVar1 = local_64, iVar3 = VariableType::getNumElements(pVStack_10),
        iVar1 < iVar3; local_64 = local_64 + 1) {
      local_68 = Scalar::min<int>();
      local_88 = (ConstStridedValueAccess<1>)
                 ValueRangeAccess::getMin((ValueRangeAccess *)&stack0x00000008);
      local_78 = (ConstStridedValueAccess<1>)
                 StridedValueAccess<1>::component((StridedValueAccess<1> *)&local_88,local_64);
      StridedValueAccess<1>::operator=((StridedValueAccess<1> *)&local_78,local_68);
      local_8c = Scalar::max<int>();
      _auStack_b0 = (ConstStridedValueAccess<1>)
                    ValueRangeAccess::getMax((ValueRangeAccess *)&stack0x00000008);
      local_a0 = (ConstStridedValueAccess<1>)
                 StridedValueAccess<1>::component((StridedValueAccess<1> *)auStack_b0,local_64);
      StridedValueAccess<1>::operator=((StridedValueAccess<1> *)&local_a0,local_8c);
    }
  }
  else {
    if (TVar2 != TYPE_BOOL) {
      this = (Exception *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_120,"setInfiniteRange(): unsupported type",&local_121);
      Exception::Exception(this,&local_120);
      __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
    }
    for (local_14 = 0; iVar1 = local_14, iVar3 = VariableType::getNumElements(pVStack_10),
        iVar1 < iVar3; local_14 = local_14 + 1) {
      local_18 = Scalar::min<bool>();
      local_38 = (ConstStridedValueAccess<1>)
                 ValueRangeAccess::getMin((ValueRangeAccess *)&stack0x00000008);
      local_28 = (ConstStridedValueAccess<1>)
                 StridedValueAccess<1>::component((StridedValueAccess<1> *)&local_38,local_14);
      StridedValueAccess<1>::operator=((StridedValueAccess<1> *)&local_28,local_18);
      local_3c = Scalar::max<bool>();
      _auStack_60 = (ConstStridedValueAccess<1>)
                    ValueRangeAccess::getMax((ValueRangeAccess *)&stack0x00000008);
      local_50 = (ConstStridedValueAccess<1>)
                 StridedValueAccess<1>::component((StridedValueAccess<1> *)auStack_60,local_14);
      StridedValueAccess<1>::operator=((StridedValueAccess<1> *)&local_50,local_3c);
    }
  }
  return;
}

Assistant:

void setInfiniteRange (ValueRangeAccess valueRange)
{
	const VariableType& type = valueRange.getType();

	switch (type.getBaseType())
	{
		case VariableType::TYPE_BOOL:
			for (int ndx = 0; ndx < type.getNumElements(); ndx++)
			{
				valueRange.getMin().component(ndx) = Scalar::min<bool>();
				valueRange.getMax().component(ndx) = Scalar::max<bool>();
			}
			break;

		case VariableType::TYPE_INT:
			for (int ndx = 0; ndx < type.getNumElements(); ndx++)
			{
				valueRange.getMin().component(ndx) = Scalar::min<int>();
				valueRange.getMax().component(ndx) = Scalar::max<int>();
			}
			break;

		case VariableType::TYPE_FLOAT:
			for (int ndx = 0; ndx < type.getNumElements(); ndx++)
			{
				valueRange.getMin().component(ndx) = Scalar::min<float>();
				valueRange.getMax().component(ndx) = Scalar::max<float>();
			}
			break;

		default:
			DE_ASSERT(DE_FALSE);
			throw Exception("setInfiniteRange(): unsupported type");
	}
}